

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

void __thiscall slang::JsonWriter::endObject(JsonWriter *this)

{
  string_view str;
  pointer __str;
  FormatBuffer *in_RDI;
  int *in_stack_00000008;
  char (*in_stack_00000010) [1];
  FormatBuffer *in_stack_00000018;
  string_view in_stack_00000020;
  size_t in_stack_ffffffffffffffb8;
  FormatBuffer *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffd8;
  JsonWriter *in_stack_ffffffffffffffe0;
  
  __str = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
          operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                     0x898308);
  findLastComma((JsonWriter *)in_RDI);
  FormatBuffer::resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (((in_RDI->buf).super_buffer<char>.capacity_ & 1) == 0) {
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0x898391);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)__str);
    str._M_str = (char *)in_stack_ffffffffffffffe0;
    str._M_len = in_stack_ffffffffffffffd8;
    FormatBuffer::append(in_RDI,str);
  }
  else {
    *(int *)&(in_RDI->buf).super_buffer<char>.size_ =
         (int)(in_RDI->buf).super_buffer<char>.size_ -
         *(int *)((long)&(in_RDI->buf).super_buffer<char>.size_ + 4);
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0x898344);
    FormatBuffer::format<char_const(&)[1],int&>
              (in_stack_00000018,(format_string<const_char_(&)[1],_int_&>)in_stack_00000020,
               in_stack_00000010,in_stack_00000008);
    endValue(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void JsonWriter::endObject() {
    buffer->resize(findLastComma());
    if (pretty) {
        currentIndent -= indentSize;
        buffer->format("\n{:{}}}}", "", currentIndent);
        endValue();
    }
    else {
        buffer->append("},");
    }
}